

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>
          (basic_appender<char> out,unsigned___int128 value,uint prefix,format_specs *specs,
          digit_grouping<char> *grouping)

{
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 n_01 [16];
  undefined1 n_02 [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  undefined1 value_03 [16];
  presentation_type pVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  make_unsigned_t<int> mVar5;
  int iVar6;
  uint in_ECX;
  ulong uVar7;
  long in_RDX;
  buffer<char> *in_RSI;
  anon_class_24_3_e2c60416 *in_RDI;
  basic_specs *in_R8;
  uint size;
  memory_buffer buffer;
  int num_digits;
  allocator<char> *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  basic_appender<char> in_stack_fffffffffffffbe8;
  undefined3 uVar8;
  int in_stack_fffffffffffffbfc;
  basic_appender<char> in_stack_fffffffffffffc00;
  char local_3c9;
  undefined8 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  basic_appender<char> in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc74;
  size_t in_stack_fffffffffffffc78;
  basic_appender<char> in_stack_fffffffffffffc80;
  buffer<char> *in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  basic_appender<char> local_360;
  undefined8 in_stack_fffffffffffffca8;
  basic_appender<char> bVar9;
  basic_appender<char> in_stack_fffffffffffffcc8;
  basic_appender<char> local_320;
  buffer<char> *local_318;
  long local_310;
  buffer<char> *local_300;
  buffer<char> *local_2f8;
  long local_2f0;
  basic_appender<char> local_2e0;
  buffer<char> *local_2d8;
  long local_2d0;
  buffer<char> *local_2c0;
  buffer<char> *local_2b8;
  long local_2b0;
  basic_appender<char> local_2a0 [3];
  buffer<char> *local_288;
  long local_280;
  bool local_272 [2];
  buffer<char> local_270 [16];
  int local_54;
  basic_specs *local_48;
  uint local_3c;
  basic_appender<char> local_38;
  long local_30;
  anon_class_24_3_e2c60416 *local_10;
  buffer<char> *local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
  iVar6 = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  local_54 = 0;
  local_48 = in_R8;
  local_3c = in_ECX;
  local_38.container = in_RSI;
  local_30 = in_RDX;
  local_10 = in_RDI;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
            );
  pVar1 = basic_specs::type(local_48);
  uVar7 = (ulong)pVar1;
  switch(uVar7) {
  default:
    local_272[0] = false;
    ignore_unused<bool,char[1]>(local_272,(char (*) [1])0x1acb1a);
  case 0:
  case 3:
    local_280 = local_30;
    local_288 = local_38.container;
    n._4_4_ = in_stack_fffffffffffffbd4;
    n._0_4_ = in_stack_fffffffffffffbd0;
    n._8_4_ = in_stack_fffffffffffffbd8;
    n._12_4_ = in_stack_fffffffffffffbdc;
    iVar3 = count_digits((uint128_opt)n);
    local_54 = iVar3;
    basic_appender<char>::basic_appender(local_2a0,local_270);
    local_2b0 = local_30;
    local_2b8 = local_38.container;
    value_00._4_4_ = iVar3;
    value_00._0_4_ = in_stack_fffffffffffffc40;
    value_00._8_8_ = uVar7;
    local_2c0 = (buffer<char> *)
                format_decimal<char,_unsigned___int128,_fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffc68,(unsigned___int128)value_00,iVar6);
    local_38.container = in_stack_fffffffffffffc88;
    break;
  case 4:
    bVar2 = basic_specs::alt(local_48);
    if (bVar2) {
      bVar2 = basic_specs::upper(local_48);
      local_3c9 = 'X';
      if (!bVar2) {
        local_3c9 = 'x';
      }
      prefix_append(&local_3c,(int)local_3c9 << 8 | 0x30);
    }
    local_2d0 = local_30;
    local_2d8 = local_38.container;
    n_00._4_4_ = in_stack_fffffffffffffbe4;
    n_00._0_4_ = in_stack_fffffffffffffbe0;
    n_00._8_8_ = in_stack_fffffffffffffbe8.container;
    local_54 = count_digits<4,unsigned__int128>((unsigned___int128)n_00);
    basic_appender<char>::basic_appender(&local_2e0,local_270);
    basic_specs::upper(local_48);
    local_2f0 = local_30;
    local_2f8 = local_38.container;
    value_01._8_8_ = in_stack_fffffffffffffc98;
    value_01._0_8_ = in_stack_fffffffffffffc90;
    local_300 = (buffer<char> *)
                format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                          (iVar3,in_stack_fffffffffffffcc8,(unsigned___int128)value_01,
                           (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffc88 >> 0x18,0));
    local_38.container = in_stack_fffffffffffffc88;
    break;
  case 5:
    local_310 = local_30;
    local_318 = local_38.container;
    n_01._4_4_ = in_stack_fffffffffffffbe4;
    n_01._0_4_ = in_stack_fffffffffffffbe0;
    n_01._8_8_ = in_stack_fffffffffffffbe8.container;
    local_54 = count_digits<3,unsigned__int128>((unsigned___int128)n_01);
    bVar2 = basic_specs::alt(local_48);
    if (((bVar2) && (*(int *)local_48[1].fill_data_ <= local_54)) &&
       (local_38.container != (buffer<char> *)0x0 || local_30 != 0)) {
      prefix_append(&local_3c,0x30);
    }
    basic_appender<char>::basic_appender(&local_320,local_270);
    value_02._8_8_ = in_stack_fffffffffffffc98;
    value_02._0_8_ = in_stack_fffffffffffffc90;
    in_stack_fffffffffffffc00 =
         format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                   (iVar3,local_38,(unsigned___int128)value_02,
                    (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffffc88 >> 0x18,0));
    local_38.container = in_stack_fffffffffffffc88;
    break;
  case 6:
    bVar2 = basic_specs::alt(local_48);
    if (bVar2) {
      bVar2 = basic_specs::upper(local_48);
      uVar8 = CONCAT12(0x62,(short)in_stack_fffffffffffffbfc);
      in_stack_fffffffffffffbfc = CONCAT13(0x42,uVar8);
      if (!bVar2) {
        in_stack_fffffffffffffbfc = CONCAT13(0x62,uVar8);
      }
      prefix_append(&local_3c,(int)(char)((uint)in_stack_fffffffffffffbfc >> 0x18) << 8 | 0x30);
    }
    n_02._4_4_ = in_stack_fffffffffffffbe4;
    n_02._0_4_ = in_stack_fffffffffffffbe0;
    n_02._8_8_ = in_stack_fffffffffffffbe8.container;
    bVar9.container = local_38.container;
    local_54 = count_digits<1,unsigned__int128>((unsigned___int128)n_02);
    iVar6 = (int)((ulong)bVar9.container >> 0x20);
    basic_appender<char>::basic_appender(&local_360,local_270);
    value_03._8_8_ = in_stack_fffffffffffffc98;
    value_03._0_8_ = local_30;
    in_stack_fffffffffffffc80 =
         format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                   (iVar6,in_stack_fffffffffffffcc8,(unsigned___int128)value_03,
                    (int)((ulong)local_38.container >> 0x20),
                    SUB81((ulong)local_38.container >> 0x18,0));
    break;
  case 7:
    local_8 = (buffer<char> *)
              write_char<char,fmt::v11::basic_appender<char>>
                        (in_stack_fffffffffffffbe8,(char)((uint)in_stack_fffffffffffffbe4 >> 0x18),
                         (format_specs *)
                         CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    goto LAB_0019ceeb;
  }
  if (local_3c == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = local_3c >> 0x18;
  }
  mVar5 = to_unsigned<int>(0);
  iVar6 = uVar4 + mVar5;
  digit_grouping<char>::count_separators
            ((digit_grouping<char> *)in_stack_fffffffffffffc00.container,in_stack_fffffffffffffbfc);
  mVar5 = to_unsigned<int>(0);
  local_8 = (buffer<char> *)
            write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>(fmt::v11::basic_appender<char>,unsigned__int128,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                      (local_38,in_stack_fffffffffffffc80.container,in_stack_fffffffffffffc78,
                       CONCAT44(in_stack_fffffffffffffc74,iVar6 + mVar5),local_10);
LAB_0019ceeb:
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x19cef8);
  return (basic_appender<char>)local_8;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_base2e<char>(4, appender(buffer), value, num_digits, specs.upper());
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt() && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_base2e<char>(3, appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_base2e<char>(1, appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}